

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimemagicrule.cpp
# Opt level: O2

bool __thiscall QMimeMagicRule::matches(QMimeMagicRule *this,QByteArray *data)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  code *pcVar4;
  long *plVar5;
  QMimeMagicRule *this_00;
  long lVar6;
  
  pcVar4 = (code *)this->m_matchFunction;
  if (pcVar4 != (code *)0x0) {
    plVar5 = (long *)((long)&(this->m_subMatches).d.d + *(long *)&this->field_0x80);
    if (((ulong)pcVar4 & 1) != 0) {
      pcVar4 = *(code **)(pcVar4 + *plVar5 + -1);
    }
    cVar2 = (*pcVar4)(plVar5,data);
    if (cVar2 != '\0') {
      lVar6 = (this->m_subMatches).d.size;
      if (lVar6 == 0) {
        return true;
      }
      this_00 = (this->m_subMatches).d.ptr;
      lVar6 = lVar6 * 0x88;
      do {
        bVar1 = lVar6 != 0;
        if (lVar6 == 0) {
          return bVar1;
        }
        bVar3 = matches(this_00,data);
        this_00 = this_00 + 1;
        lVar6 = lVar6 + -0x88;
      } while (!bVar3);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool QMimeMagicRule::matches(const QByteArray &data) const
{
    const bool ok = m_matchFunction && (this->*m_matchFunction)(data);
    if (!ok)
        return false;

    // No submatch? Then we are done.
    if (m_subMatches.isEmpty())
        return true;

    //qDebug() << "Checking" << m_subMatches.count() << "sub-rules";
    // Check that one of the submatches matches too
    for ( QList<QMimeMagicRule>::const_iterator it = m_subMatches.begin(), end = m_subMatches.end() ;
          it != end ; ++it ) {
        if ((*it).matches(data)) {
            // One of the hierarchies matched -> mimetype recognized.
            return true;
        }
    }
    return false;


}